

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O3

ssl_hs_wait_t bssl::ssl_get_finished(SSL_HANDSHAKE *hs)

{
  SSL *ssl;
  SSL3_STATE *pSVar1;
  InplaceVector<unsigned_char,_12UL> *pIVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  SSL_SESSION *session;
  ssl_hs_wait_t sVar6;
  int line;
  size_t finished_len;
  SSLMessage msg;
  uint8_t finished [64];
  size_t local_98;
  SSLMessage local_90;
  uint8_t local_68 [72];
  
  ssl = hs->ssl;
  bVar3 = (*ssl->method->get_message)(ssl,&local_90);
  sVar6 = ssl_hs_read_message;
  if (bVar3) {
    bVar3 = ssl_check_message_type(ssl,&local_90,0x14);
    sVar6 = ssl_hs_error;
    if (bVar3) {
      session = (hs->new_session)._M_t.
                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
      if (session == (SSL_SESSION *)0x0) {
        session = (hs->ssl->session)._M_t.
                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
      }
      bVar3 = SSLTranscript::GetFinishedMAC
                        (&hs->transcript,local_68,&local_98,session,(bool)(~ssl->field_0xa4 & 1));
      sVar6 = ssl_hs_error;
      if (bVar3) {
        if ((local_90.is_v2_hello == false) &&
           (bVar3 = SSLTranscript::Update(&hs->transcript,(Span<const_unsigned_char>)local_90.raw),
           !bVar3)) {
          return ssl_hs_error;
        }
        iVar4 = CBS_mem_equal(&local_90.body,local_68,local_98);
        if (iVar4 == 0) {
          ssl_send_alert(ssl,2,0x33);
          iVar4 = 0x8e;
          line = 0x18c;
        }
        else if (local_98 < 0xd) {
          pSVar1 = ssl->s3;
          if ((ssl->field_0xa4 & 1) == 0) {
            pIVar2 = &pSVar1->previous_server_finished;
            (pSVar1->previous_server_finished).size_ = '\0';
            lVar5 = 0x1f0;
          }
          else {
            pIVar2 = &pSVar1->previous_client_finished;
            (pSVar1->previous_client_finished).size_ = '\0';
            lVar5 = 0x1e3;
          }
          if (local_98 != 0) {
            memmove(pSVar1->server_random + lVar5 + -0x10,local_68,local_98);
          }
          pIVar2->size_ = (PackedSize<12UL>)local_98;
          bVar3 = (*ssl->method->has_unprocessed_handshake_data)(ssl);
          if (!bVar3) {
            (*ssl->method->next_message)(ssl);
            return ssl_hs_ok;
          }
          ssl_send_alert(ssl,2,10);
          iVar4 = 0xff;
          line = 0x1a0;
        }
        else {
          iVar4 = 0x44;
          line = 0x193;
        }
        sVar6 = ssl_hs_error;
        ERR_put_error(0x10,0,iVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                      ,line);
      }
    }
  }
  return sVar6;
}

Assistant:

enum ssl_hs_wait_t ssl_get_finished(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  SSLMessage msg;
  if (!ssl->method->get_message(ssl, &msg)) {
    return ssl_hs_read_message;
  }

  if (!ssl_check_message_type(ssl, msg, SSL3_MT_FINISHED)) {
    return ssl_hs_error;
  }

  // Snapshot the finished hash before incorporating the new message.
  uint8_t finished[EVP_MAX_MD_SIZE];
  size_t finished_len;
  if (!hs->transcript.GetFinishedMAC(finished, &finished_len,
                                     ssl_handshake_session(hs), !ssl->server) ||
      !ssl_hash_message(hs, msg)) {
    return ssl_hs_error;
  }

  bool finished_ok = CBS_mem_equal(&msg.body, finished, finished_len);
  if (CRYPTO_fuzzer_mode_enabled()) {
    finished_ok = true;
  }
  if (!finished_ok) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECRYPT_ERROR);
    OPENSSL_PUT_ERROR(SSL, SSL_R_DIGEST_CHECK_FAILED);
    return ssl_hs_error;
  }

  // Copy the Finished so we can use it for renegotiation checks.
  if (finished_len > ssl->s3->previous_client_finished.capacity() ||
      finished_len > ssl->s3->previous_server_finished.capacity()) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return ssl_hs_error;
  }

  if (ssl->server) {
    ssl->s3->previous_client_finished.CopyFrom(Span(finished, finished_len));
  } else {
    ssl->s3->previous_server_finished.CopyFrom(Span(finished, finished_len));
  }

  // The Finished message should be the end of a flight.
  if (ssl->method->has_unprocessed_handshake_data(ssl)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_UNEXPECTED_MESSAGE);
    OPENSSL_PUT_ERROR(SSL, SSL_R_EXCESS_HANDSHAKE_DATA);
    return ssl_hs_error;
  }

  ssl->method->next_message(ssl);
  return ssl_hs_ok;
}